

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O3

uchar pseudo_median<unsigned_char>(uchar **strings,size_t N,size_t depth)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar *puVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  
  puVar4 = *strings;
  if (N < 0x1f) {
    if (((puVar4 != (uchar *)0x0) &&
        (lVar5 = *(long *)((long)strings + (N & 0xfffffffffffffffe) * 4), lVar5 != 0)) &&
       (strings[N - 1] != (uchar *)0x0)) {
      bVar1 = puVar4[depth];
      bVar2 = *(byte *)(lVar5 + depth);
      bVar7 = bVar1;
      if (((bVar1 != bVar2) && (bVar6 = strings[N - 1][depth], bVar7 = bVar6, bVar6 != bVar1)) &&
         (bVar6 != bVar2)) {
        bVar7 = bVar2;
        if (bVar1 < bVar2) {
          if ((bVar6 <= bVar2) && (bVar7 = bVar6, bVar6 < bVar1)) {
            bVar7 = bVar1;
          }
        }
        else if ((bVar2 <= bVar6) && (bVar7 = bVar6, bVar1 < bVar6)) {
          bVar7 = bVar1;
        }
      }
      return bVar7;
    }
  }
  else if (((puVar4 != (uchar *)0x0) && (strings[1] != (uchar *)0x0)) &&
          (strings[2] != (uchar *)0x0)) {
    bVar1 = puVar4[depth];
    bVar2 = strings[1][depth];
    bVar7 = bVar1;
    if ((bVar1 != bVar2) &&
       (bVar6 = strings[2][depth], bVar7 = bVar6, bVar6 != bVar2 && bVar6 != bVar1)) {
      bVar7 = bVar2;
      if (bVar1 < bVar2) {
        if ((bVar6 <= bVar2) && (bVar7 = bVar6, bVar6 < bVar1)) {
          bVar7 = bVar1;
        }
      }
      else if ((bVar2 <= bVar6) && (bVar7 = bVar6, bVar1 < bVar6)) {
        bVar7 = bVar1;
      }
    }
    uVar9 = N >> 1;
    if (((strings[uVar9] != (uchar *)0x0) && (strings[uVar9 + 1] != (uchar *)0x0)) &&
       (strings[uVar9 + 2] != (uchar *)0x0)) {
      bVar1 = strings[uVar9][depth];
      bVar2 = strings[uVar9 + 1][depth];
      bVar6 = bVar1;
      if (((bVar1 != bVar2) && (bVar8 = strings[uVar9 + 2][depth], bVar6 = bVar8, bVar8 != bVar1))
         && (bVar8 != bVar2)) {
        bVar6 = bVar2;
        if (bVar1 < bVar2) {
          if ((bVar8 <= bVar2) && (bVar6 = bVar8, bVar8 < bVar1)) {
            bVar6 = bVar1;
          }
        }
        else if ((bVar2 <= bVar8) && (bVar6 = bVar8, bVar1 < bVar8)) {
          bVar6 = bVar1;
        }
      }
      if (((strings[N - 3] != (uchar *)0x0) && (strings[N - 2] != (uchar *)0x0)) &&
         (strings[N - 1] != (uchar *)0x0)) {
        bVar1 = strings[N - 3][depth];
        bVar2 = strings[N - 2][depth];
        bVar8 = bVar1;
        if (((bVar1 != bVar2) && (bVar3 = strings[N - 1][depth], bVar8 = bVar3, bVar3 != bVar1)) &&
           (bVar3 != bVar2)) {
          bVar8 = bVar2;
          if (bVar1 < bVar2) {
            if ((bVar3 <= bVar2) && (bVar8 = bVar3, bVar3 < bVar1)) {
              bVar8 = bVar1;
            }
          }
          else if ((bVar2 <= bVar3) && (bVar8 = bVar3, bVar1 < bVar3)) {
            bVar8 = bVar1;
          }
        }
        if (bVar7 == bVar6) {
          return bVar7;
        }
        if (bVar8 == bVar7) {
          return bVar8;
        }
        if (bVar8 == bVar6) {
          return bVar8;
        }
        if (bVar6 <= bVar7) {
          if (bVar8 < bVar6) {
            return bVar6;
          }
          if (bVar8 <= bVar7) {
            return bVar8;
          }
          return bVar7;
        }
        if (bVar6 < bVar8) {
          return bVar6;
        }
        if (bVar7 <= bVar8) {
          return bVar8;
        }
        return bVar7;
      }
    }
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x26,"unsigned char get_char(unsigned char *, size_t)");
}

Assistant:

CharT
pseudo_median(unsigned char** strings, size_t N, size_t depth)
{
	if (N > 30)
		return med3char(
			med3char(
				get_char<CharT>(strings[0], depth),
				get_char<CharT>(strings[1], depth),
				get_char<CharT>(strings[2], depth)
				),
			med3char(
				get_char<CharT>(strings[N/2  ], depth),
				get_char<CharT>(strings[N/2+1], depth),
				get_char<CharT>(strings[N/2+2], depth)
				),
			med3char(
				get_char<CharT>(strings[N-3], depth),
				get_char<CharT>(strings[N-2], depth),
				get_char<CharT>(strings[N-1], depth)
				)
		       );
	else
		return med3char(get_char<CharT>(strings[0  ], depth),
				get_char<CharT>(strings[N/2], depth),
				get_char<CharT>(strings[N-1], depth));
}